

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::FieldOptions::_InternalParse(FieldOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  uint uVar5;
  pair<const_char_*,_unsigned_long> pVar6;
  UninterpretedOption *msg;
  char cVar7;
  uint32 uVar8;
  uint tag;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  char cVar9;
  uint uVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  pair<const_char_*,_bool> pVar14;
  
  uVar10 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar14._8_8_ = 0;
      pVar14.first = ptr;
    }
    else {
      pVar14._8_8_ = 1;
      pVar14.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar14 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar14.first;
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_002fb161;
    bVar1 = *ptr;
    pVar11.second._0_1_ = bVar1;
    pVar11.first = (char *)((byte *)ptr + 1);
    pVar11._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = internal::ReadTagFallback(ptr,uVar8);
      }
      else {
        pVar11.second = uVar8;
        pVar11.first = (char *)((byte *)ptr + 2);
        pVar11._12_4_ = 0;
      }
    }
    ptr = pVar11.first;
    cVar9 = '\x04';
    if ((byte *)ptr != (byte *)0x0) {
      tag = pVar11.second;
      uVar5 = (uint)(pVar11._8_8_ >> 3) & 0x1fffffff;
      cVar7 = (char)pVar11.second;
      switch(uVar5) {
      case 1:
        if (cVar7 == '\b') {
          bVar1 = *ptr;
          pVar13.second = (long)(char)bVar1;
          pVar13.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar13 = internal::VarintParseSlow64(ptr,uVar8);
            }
            else {
              pVar13.second._0_4_ = uVar8;
              pVar13.first = (char *)((byte *)ptr + 2);
              pVar13.second._4_4_ = 0;
            }
          }
          ptr = pVar13.first;
          if ((byte *)ptr != (byte *)0x0) {
            if ((uint)pVar13.second < 3) {
              *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
              this->ctype_ = (uint)pVar13.second;
            }
            else {
              _InternalParse();
              pVar13.second = extraout_RDX_00;
              pVar13.first = ptr;
            }
            goto LAB_002fb04e;
          }
          goto LAB_002fb0f1;
        }
        break;
      case 2:
        if (cVar7 == '\x10') {
          bVar1 = *ptr;
          pVar12.second = (long)(char)bVar1;
          pVar12.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar12 = internal::VarintParseSlow64(ptr,uVar8);
            }
            else {
              pVar12.second._0_4_ = uVar8;
              pVar12.first = (char *)((byte *)ptr + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 2;
          this->packed_ = pVar12.second != 0;
LAB_002fb0de:
          ptr = pVar12.first;
          cVar9 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_002fb0f1;
        }
        break;
      case 3:
        if (cVar7 == '\x18') {
          bVar1 = *ptr;
          pVar12.second = (long)(char)bVar1;
          pVar12.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar12 = internal::VarintParseSlow64(ptr,uVar8);
            }
            else {
              pVar12.second._0_4_ = uVar8;
              pVar12.first = (char *)((byte *)ptr + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 8;
          this->deprecated_ = pVar12.second != 0;
          goto LAB_002fb0de;
        }
        break;
      case 4:
      case 7:
      case 8:
      case 9:
        break;
      case 5:
        if (cVar7 == '(') {
          bVar1 = *ptr;
          pVar12.second = (long)(char)bVar1;
          pVar12.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar12 = internal::VarintParseSlow64(ptr,uVar8);
            }
            else {
              pVar12.second._0_4_ = uVar8;
              pVar12.first = (char *)((byte *)ptr + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 4;
          this->lazy_ = pVar12.second != 0;
          goto LAB_002fb0de;
        }
        break;
      case 6:
        if (cVar7 == '0') {
          bVar1 = *ptr;
          pVar13.second = (long)(char)bVar1;
          pVar13.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar13 = internal::VarintParseSlow64(ptr,uVar8);
            }
            else {
              pVar13.second._0_4_ = uVar8;
              pVar13.first = (char *)((byte *)ptr + 2);
              pVar13.second._4_4_ = 0;
            }
          }
          ptr = pVar13.first;
          if ((byte *)ptr != (byte *)0x0) {
            if ((uint)pVar13.second < 3) {
              *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
              this->jstype_ = (uint)pVar13.second;
            }
            else {
              _InternalParse();
              pVar13.second = extraout_RDX_01;
              pVar13.first = ptr;
            }
            goto LAB_002fb04e;
          }
          goto LAB_002fb0f1;
        }
        break;
      case 10:
        if (cVar7 == 'P') {
          bVar1 = *ptr;
          pVar12.second = (long)(char)bVar1;
          pVar12.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar12 = internal::VarintParseSlow64(ptr,uVar8);
            }
            else {
              pVar12.second._0_4_ = uVar8;
              pVar12.first = (char *)((byte *)ptr + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x10;
          this->weak_ = pVar12.second != 0;
          goto LAB_002fb0de;
        }
        break;
      default:
        if ((uVar5 == 999) && (cVar7 == ':')) {
          ptr = (char *)((byte *)ptr + -2);
          do {
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002faddf:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002fadee:
              pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                              ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002faddf;
                goto LAB_002fadee;
              }
              (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (UninterpretedOption *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                            (ctx,msg,(char *)((byte *)ptr + 2));
            pVar13.second = extraout_RDX;
            pVar13.first = ptr;
            pVar6.second = extraout_RDX;
            pVar6.first = ptr;
            if ((byte *)ptr == (byte *)0x0) goto LAB_002fb0f1;
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) &&
                  (pVar13 = pVar6, *(short *)ptr == 0x3eba));
LAB_002fb04e:
          ptr = pVar13.first;
          cVar9 = '\x02';
          goto LAB_002fb0f1;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar9 = '\t';
      }
      else {
        if (tag < 8000) {
          ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        }
        else {
          ptr = internal::ExtensionSet::ParseField
                          (&this->_extensions_,pVar11._8_8_ & 0xffffffff,ptr,
                           (Message *)_FieldOptions_default_instance_,&this->_internal_metadata_,ctx
                          );
        }
        cVar9 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002fb0f1:
  } while (cVar9 == '\x02');
  if (cVar9 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_002fb161:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
  return (char *)(byte *)ptr;
}

Assistant:

const char* FieldOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_CType_IsValid(val))) {
            _internal_set_ctype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_CType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(1, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool packed = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_packed(&has_bits);
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool lazy = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_lazy(&has_bits);
          lazy_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_JSType_IsValid(val))) {
            _internal_set_jstype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_JSType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool weak = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_weak(&has_bits);
          weak_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}